

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int streamProcessTest(char *filename,char *result,char *err,xmlTextReaderPtr reader,char *rng,
                     int options)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  FILE *__stream;
  undefined4 *puVar4;
  char *pcVar5;
  long lVar6;
  xmlTextReaderPtr pxVar7;
  char cVar8;
  undefined4 in_register_0000008c;
  undefined8 uVar9;
  bool bVar10;
  undefined8 uStack_160;
  undefined1 *puStack_158;
  undefined1 *puStack_150;
  undefined1 auStack_140 [24];
  xmlTextReaderPtr pxStack_128;
  char *pcStack_120;
  undefined8 uStack_118;
  undefined8 uStack_88;
  undefined1 auStack_70 [15];
  char local_61;
  char *local_60;
  char *local_58;
  char *local_50;
  uint local_44;
  char *local_40;
  char *local_38;
  
  uVar9 = CONCAT44(in_register_0000008c,options);
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  nb_tests = nb_tests + 1;
  local_58 = filename;
  local_50 = rng;
  local_40 = result;
  local_38 = err;
  if (result == (char *)0x0) {
    local_60 = (char *)0x0;
    __stream = (FILE *)0x0;
  }
  else {
    pxVar7 = reader;
    pcVar5 = temp_directory;
    local_60 = resultFilename(filename,temp_directory,".res");
    if (local_60 == (char *)0x0) {
      streamProcessTest_cold_2();
      uStack_88 = 0xffffffff;
      iVar1 = testErrorsSize;
      if ((long)testErrorsSize < 0x8000) {
        puStack_150 = auStack_140;
        puStack_158 = auStack_70;
        uStack_160 = 0x3000000010;
        pxStack_128 = pxVar7;
        pcStack_120 = rng;
        uStack_118 = uVar9;
        iVar1 = vsnprintf(testErrors + testErrorsSize,(ulong)(0x8000 - testErrorsSize),pcVar5,
                          &uStack_160);
        testErrorsSize = iVar1 + testErrorsSize;
        if (0x7fff < testErrorsSize) {
          testErrorsSize = 0x8000;
          testErrors[0x8000] = '\0';
        }
        iVar1 = testErrorsSize;
        testErrors[testErrorsSize] = '\0';
      }
      return iVar1;
    }
    __stream = fopen64(local_60,"wb");
    if (__stream == (FILE *)0x0) {
      streamProcessTest_cold_1();
      return -1;
    }
  }
  if ((local_50 != (char *)0x0) &&
     (pxVar7 = reader, iVar1 = xmlTextReaderRelaxNGValidate(reader,local_50), iVar1 < 0)) {
    testErrorHandler(pxVar7,"Relax-NG schema %s failed to compile\n",local_50);
    fclose(__stream);
    pcVar5 = local_60;
    if (local_60 != (char *)0x0) {
      unlink(local_60);
      free(pcVar5);
      return 0;
    }
    return 0;
  }
  bVar10 = local_50 == (char *)0x0;
  puVar4 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar4 = 1;
  pxVar7 = reader;
  iVar1 = xmlTextReaderRead();
  cVar8 = __stream != (FILE *)0x0 && bVar10;
  local_61 = cVar8;
  while (iVar1 == 1) {
    if (cVar8 != '\0') {
      local_44 = xmlTextReaderNodeType(reader);
      uVar2 = xmlTextReaderIsEmptyElement(reader);
      pcVar5 = (char *)xmlTextReaderConstName(reader);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "--";
      }
      lVar6 = xmlTextReaderConstValue(reader);
      uVar3 = xmlTextReaderDepth(reader);
      xmlTextReaderHasValue(reader);
      fprintf(__stream,"%d %d %s %d %d",(ulong)uVar3,(ulong)local_44,pcVar5,(ulong)uVar2);
      if (lVar6 == 0) {
        fputc(10,__stream);
        cVar8 = local_61;
      }
      else {
        fprintf(__stream," %s\n",lVar6);
        cVar8 = local_61;
      }
    }
    pxVar7 = reader;
    iVar1 = xmlTextReaderRead();
  }
  if (iVar1 != 0) {
    testErrorHandler(pxVar7,"%s : failed to parse\n",local_58);
  }
  if (local_50 != (char *)0x0) {
    iVar1 = xmlTextReaderIsValid();
    pcVar5 = "%s fails to validate\n";
    if (iVar1 == 1) {
      pcVar5 = "%s validates\n";
    }
    testErrorHandler(reader,pcVar5,local_58);
  }
  puVar4 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar4 = 0;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    pcVar5 = local_60;
    iVar1 = compareFiles(local_60,local_40);
    if (pcVar5 != (char *)0x0) {
      unlink(pcVar5);
      free(pcVar5);
    }
    if (iVar1 != 0) {
      fprintf(_stderr,"Result for %s failed in %s\n",local_58,local_40);
      return -1;
    }
  }
  if (local_38 == (char *)0x0) {
    return 0;
  }
  iVar1 = compareFileMem(local_38,testErrors,testErrorsSize);
  if (iVar1 != 0) {
    streamProcessTest_cold_3();
    return -1;
  }
  return 0;
}

Assistant:

static int
streamProcessTest(const char *filename, const char *result, const char *err,
                  xmlTextReaderPtr reader, const char *rng,
                  int options ATTRIBUTE_UNUSED) {
    int ret;
    char *temp = NULL;
    FILE *t = NULL;

    if (reader == NULL)
        return(-1);

    nb_tests++;
    if (result != NULL) {
	temp = resultFilename(filename, temp_directory, ".res");
	if (temp == NULL) {
	    fprintf(stderr, "Out of memory\n");
	    fatalError();
	}
	t = fopen(temp, "wb");
	if (t == NULL) {
	    fprintf(stderr, "Can't open temp file %s\n", temp);
	    free(temp);
	    return(-1);
	}
    }
#ifdef LIBXML_SCHEMAS_ENABLED
    if (rng != NULL) {
	ret = xmlTextReaderRelaxNGValidate(reader, rng);
	if (ret < 0) {
	    testErrorHandler(NULL, "Relax-NG schema %s failed to compile\n",
	                     rng);
	    fclose(t);
            if (temp != NULL) {
                unlink(temp);
                free(temp);
            }
	    return(0);
	}
    }
#endif
    xmlGetWarningsDefaultValue = 1;
    ret = xmlTextReaderRead(reader);
    while (ret == 1) {
	if ((t != NULL) && (rng == NULL))
	    processNode(t, reader);
        ret = xmlTextReaderRead(reader);
    }
    if (ret != 0) {
        testErrorHandler(NULL, "%s : failed to parse\n", filename);
    }
    if (rng != NULL) {
        if (xmlTextReaderIsValid(reader) != 1) {
	    testErrorHandler(NULL, "%s fails to validate\n", filename);
	} else {
	    testErrorHandler(NULL, "%s validates\n", filename);
	}
    }
    xmlGetWarningsDefaultValue = 0;
    if (t != NULL) {
        fclose(t);
	ret = compareFiles(temp, result);
        if (temp != NULL) {
            unlink(temp);
            free(temp);
        }
	if (ret) {
	    fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	    return(-1);
	}
    }
    if (err != NULL) {
	ret = compareFileMem(err, testErrors, testErrorsSize);
	if (ret != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    printf("%s", testErrors);
	    return(-1);
	}
    }

    return(0);
}